

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::StringMaker<bool,void>::convert_abi_cxx11_
          (string *__return_storage_ptr__,StringMaker<bool,void> *this,bool b)

{
  char *pcVar1;
  allocator local_9;
  
  pcVar1 = "read bool field using pbf_message: false";
  if ((int)this != 0) {
    pcVar1 = "read bool field using pbf_message: true";
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1 + 0x23,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string StringMaker<bool>::convert(bool b) {
    return b ? "true" : "false";
}